

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_data.hpp
# Opt level: O0

string * __thiscall
duckdb::MultiFileColumnDefinition::GetIdentifierName_abi_cxx11_(MultiFileColumnDefinition *this)

{
  bool bVar1;
  string *in_RSI;
  Value *in_RDI;
  Value *this_00;
  
  this_00 = in_RDI;
  bVar1 = Value::IsNull((Value *)(in_RSI + 0x58));
  if (bVar1) {
    ::std::__cxx11::string::string((string *)this_00,in_RSI);
  }
  else {
    Value::GetValue<std::__cxx11::string>(this_00);
  }
  return (string *)in_RDI;
}

Assistant:

string GetIdentifierName() const {
		if (identifier.IsNull()) {
			// No identifier was provided, assume the name as the identifier
			return name;
		}
		D_ASSERT(identifier.type().id() == LogicalTypeId::VARCHAR);
		return identifier.GetValue<string>();
	}